

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object_State_Header.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Object_State_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Object_State_Header *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Object_State_Header *local_18;
  Object_State_Header *this_local;
  
  local_18 = this;
  this_local = (Object_State_Header *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Object ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1d0,&this->m_ObjID);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"Referenced Object ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_RefObjID);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"Update Number: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16UpdateNum);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Force ID:      ");
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)this->m_ui8ForceID,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Object_State_Header::GetAsString() const
{
    KStringStream ss;

    // We will let the derived pdu get the header string so they can insert their
    // name between the header values and these.
    ss << "Object ID:\n"
       << m_ObjID.GetAsString()
       << "Referenced Object ID:\n"
       << m_RefObjID.GetAsString()
       << "Update Number: " << m_ui16UpdateNum                        << "\n"
       << "Force ID:      " << GetEnumAsStringForceID( m_ui8ForceID ) << "\n";

    return ss.str();
}